

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O3

char * u_strToUTF8WithSub_63
                 (char *dest,int32_t destCapacity,int32_t *pDestLength,UChar *pSrc,int32_t srcLength
                 ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  UChar UVar1;
  int iVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  ulong uVar5;
  UChar UVar6;
  uint c;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  UChar *pUVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  int local_48;
  
  pbVar17 = (byte *)(dest + destCapacity);
  if (dest == (char *)0x0) {
    pbVar17 = (byte *)0x0;
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((-1 < destCapacity) && (-2 < srcLength)) && (pSrc != (UChar *)0x0 || srcLength == 0)) &&
       ((subchar < 0x110000 && (destCapacity == 0 || dest != (char *)0x0)) &&
        (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      pbVar10 = (byte *)dest;
      if (srcLength == -1) {
        UVar6 = *pSrc;
        if (UVar6 == L'\0') {
          uVar14 = 0;
          local_48 = 0;
        }
        else {
          local_48 = 0;
          do {
            pUVar3 = pSrc + 1;
            bVar7 = (byte)UVar6;
            if ((ushort)UVar6 < 0x80) {
              if (pbVar17 <= pbVar10) {
                uVar16 = 1;
                goto LAB_002d2196;
              }
              *pbVar10 = bVar7;
LAB_002d1c5d:
              pbVar10 = pbVar10 + 1;
            }
            else if ((ushort)UVar6 < 0x800) {
              if ((long)pbVar17 - (long)pbVar10 < 2) {
                uVar16 = 2;
                goto LAB_002d2196;
              }
              *pbVar10 = (byte)((ushort)UVar6 >> 6) | 0xc0;
              pbVar10[1] = bVar7 & 0x3f | 0x80;
LAB_002d1c95:
              pbVar10 = pbVar10 + 2;
            }
            else if ((ushort)(UVar6 + L'\x2000') < 0xf800) {
              if ((long)pbVar17 - (long)pbVar10 < 3) {
                uVar16 = 3;
LAB_002d2196:
                uVar14 = (uint)uVar16;
                UVar6 = *pUVar3;
                if (UVar6 != L'\0') {
                  iVar15 = 3;
                  if ((uint)subchar < 0x800) {
                    iVar15 = 2 - (uint)((uint)subchar < 0x80);
                  }
                  iVar2 = 0;
                  if (0xdfff < (uint)subchar) {
                    iVar2 = 4 - (uint)((uint)subchar < 0x10000);
                  }
                  if ((uint)subchar < 0xd800) {
                    iVar2 = iVar15;
                  }
                  do {
                    pUVar13 = pUVar3 + 1;
                    iVar15 = (int)uVar16;
                    if ((ushort)UVar6 < 0x80) {
                      uVar16 = (ulong)(iVar15 + 1);
                      pUVar3 = pUVar13;
                    }
                    else if ((ushort)UVar6 < 0x800) {
                      uVar16 = (ulong)(iVar15 + 2);
                      pUVar3 = pUVar13;
                    }
                    else if ((UVar6 & 0xf800U) == 0xd800) {
                      if ((((ushort)UVar6 >> 10 & 1) == 0) && ((*pUVar13 & 0xfc00U) == 0xdc00)) {
                        uVar16 = (ulong)(iVar15 + 4);
                        pUVar3 = pUVar3 + 2;
                      }
                      else {
                        if (subchar < 0) {
LAB_002d228d:
                          *pErrorCode = U_INVALID_CHAR_FOUND;
                          return (char *)0x0;
                        }
                        uVar16 = (ulong)(uint)(iVar15 + iVar2);
                        local_48 = local_48 + 1;
                        pUVar3 = pUVar13;
                      }
                    }
                    else {
                      uVar16 = (ulong)(iVar15 + 3);
                      pUVar3 = pUVar13;
                    }
                    uVar14 = (uint)uVar16;
                    UVar6 = *pUVar3;
                  } while (UVar6 != L'\0');
                }
                goto LAB_002d2263;
              }
              *pbVar10 = (byte)((ushort)UVar6 >> 0xc) | 0xe0;
              pbVar10[1] = (byte)((ushort)UVar6 >> 6) & 0x3f | 0x80;
              pbVar10[2] = bVar7 & 0x3f | 0x80;
LAB_002d1ce3:
              pbVar10 = pbVar10 + 3;
            }
            else {
              if ((((ushort)UVar6 >> 10 & 1) == 0) && (UVar1 = *pUVar3, (UVar1 & 0xfc00U) == 0xdc00)
                 ) {
                pUVar3 = pSrc + 2;
                uVar14 = (uint)(ushort)UVar6 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
              }
              else {
                if (subchar < 0) goto LAB_002d228d;
                local_48 = local_48 + 1;
                uVar14 = subchar;
              }
              uVar16 = 1;
              if (((0x7f < uVar14) && (uVar16 = 2, 0x7ff < uVar14)) &&
                 ((uVar16 = 3, 0xd7ff < uVar14 && (uVar16 = 0, 0xffefdfff < uVar14 - 0x110000)))) {
                uVar16 = (ulong)(4 - (uVar14 < 0x10000));
              }
              if ((long)pbVar17 - (long)pbVar10 < (long)uVar16) goto LAB_002d2196;
              bVar7 = (byte)uVar14;
              if ((int)uVar14 < 0x80) {
                *pbVar10 = bVar7;
                goto LAB_002d1c5d;
              }
              if (uVar14 < 0x800) {
                *pbVar10 = (byte)(uVar14 >> 6) | 0xc0;
                pbVar10[1] = bVar7 & 0x3f | 0x80;
                goto LAB_002d1c95;
              }
              if (uVar14 < 0x10000) {
                *pbVar10 = (byte)(uVar14 >> 0xc) | 0xe0;
                pbVar10[1] = (byte)(uVar14 >> 6) & 0x3f | 0x80;
                pbVar10[2] = bVar7 & 0x3f | 0x80;
                goto LAB_002d1ce3;
              }
              *pbVar10 = (byte)(uVar14 >> 0x12) | 0xf0;
              pbVar10[1] = (byte)(uVar14 >> 0xc) & 0x3f | 0x80;
              pbVar10[2] = (byte)(uVar14 >> 6) & 0x3f | 0x80;
              pbVar10[3] = bVar7 & 0x3f | 0x80;
              pbVar10 = pbVar10 + 4;
            }
            UVar6 = *pUVar3;
            pSrc = pUVar3;
          } while (UVar6 != L'\0');
          uVar14 = 0;
        }
      }
      else {
        pUVar3 = pSrc + (uint)srcLength;
        if (pSrc == (UChar *)0x0) {
          pUVar3 = (UChar *)0x0;
        }
        uVar16 = ((long)pbVar17 - (long)dest) / 3;
        uVar5 = (ulong)((long)pUVar3 - (long)pSrc) >> 1;
        if ((int)uVar5 <= (int)uVar16) {
          uVar16 = uVar5;
        }
        uVar5 = uVar16 & 0xffffffff;
        if ((int)uVar16 < 3) {
          local_48 = 0;
        }
        else {
          bVar7 = (byte)((uint)subchar >> 0xc);
          bVar8 = (byte)((uint)subchar >> 6);
          bVar9 = bVar8 & 0x3f | 0x80;
          bVar12 = (byte)subchar & 0x3f | 0x80;
          local_48 = 0;
LAB_002d1e9a:
          do {
            iVar15 = (int)uVar5;
            pUVar13 = pSrc + 1;
            UVar6 = *pSrc;
            bVar11 = (byte)UVar6;
            if ((ushort)UVar6 < 0x80) {
              *pbVar10 = bVar11;
LAB_002d1eab:
              pbVar10 = pbVar10 + 1;
              pSrc = pUVar13;
LAB_002d1f14:
              uVar5 = (ulong)(iVar15 - 1);
              if (1 < iVar15) goto LAB_002d1e9a;
            }
            else {
              if ((ushort)UVar6 < 0x800) {
                *pbVar10 = (byte)((ushort)UVar6 >> 6) | 0xc0;
                pbVar10[1] = bVar11 & 0x3f | 0x80;
LAB_002d1ed0:
                pbVar10 = pbVar10 + 2;
                pSrc = pUVar13;
                goto LAB_002d1f14;
              }
              if (((ushort)UVar6 + 0x2000 & 0xffff) < 0xf800) {
                *pbVar10 = (byte)((ushort)UVar6 >> 0xc) | 0xe0;
                pbVar10[1] = (byte)((ushort)UVar6 >> 6) & 0x3f | 0x80;
                pbVar10[2] = bVar11 & 0x3f | 0x80;
                pbVar10 = pbVar10 + 3;
                pSrc = pUVar13;
                goto LAB_002d1f14;
              }
              iVar15 = iVar15 + -1;
              if (iVar15 != 0) {
                if (((ushort)UVar6 >> 10 & 1) == 0) {
                  UVar1 = *pUVar13;
                  if ((UVar1 & 0xfc00U) == 0xdc00) {
                    uVar14 = (uint)(ushort)UVar6 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
                    *pbVar10 = (byte)(uVar14 >> 0x12) | 0xf0;
                    pbVar10[1] = (byte)(uVar14 >> 0xc) & 0x3f | 0x80;
                    pbVar10[2] = (byte)(uVar14 >> 6) & 0x3f | 0x80;
                    pbVar10[3] = (byte)UVar1 & 0x3f | 0x80;
                    pbVar10 = pbVar10 + 4;
                    pSrc = pSrc + 2;
                    goto LAB_002d1f14;
                  }
                }
                if (-1 < subchar) {
                  local_48 = local_48 + 1;
                  if ((uint)subchar < 0x80) {
                    *pbVar10 = (byte)subchar;
                    goto LAB_002d1eab;
                  }
                  if ((uint)subchar < 0x800) {
                    *pbVar10 = bVar8 | 0xc0;
                    pbVar10[1] = bVar12;
                    goto LAB_002d1ed0;
                  }
                  if ((uint)subchar < 0x10000) {
                    *pbVar10 = bVar7 | 0xe0;
                    pbVar10[1] = bVar9;
                    pbVar10[2] = bVar12;
                    pbVar10 = pbVar10 + 3;
                    pSrc = pUVar13;
                  }
                  else {
                    *pbVar10 = (byte)((uint)subchar >> 0x12) | 0xf0;
                    pbVar10[1] = bVar7 & 0x3f | 0x80;
                    pbVar10[2] = bVar9;
                    pbVar10[3] = bVar12;
                    pbVar10 = pbVar10 + 4;
                    pSrc = pUVar13;
                  }
                  goto LAB_002d1f14;
                }
                goto LAB_002d2152;
              }
            }
            uVar16 = ((long)pbVar17 - (long)pbVar10) / 3;
            uVar5 = (ulong)((long)pUVar3 - (long)pSrc) >> 1;
            if ((int)uVar5 <= (int)uVar16) {
              uVar16 = uVar5;
            }
            uVar5 = uVar16 & 0xffffffff;
          } while (2 < (int)uVar16);
        }
        while (pUVar13 = pSrc, uVar14 = 0, pSrc < pUVar3) {
          pUVar13 = pSrc + 1;
          UVar6 = *pSrc;
          bVar7 = (byte)UVar6;
          if ((ushort)UVar6 < 0x80) {
            if (pbVar17 <= pbVar10) {
              uVar14 = 1;
              break;
            }
            *pbVar10 = bVar7;
            pbVar10 = pbVar10 + 1;
            pSrc = pUVar13;
          }
          else if ((ushort)UVar6 < 0x800) {
            if ((long)pbVar17 - (long)pbVar10 < 2) {
              uVar14 = 2;
              break;
            }
            *pbVar10 = (byte)((ushort)UVar6 >> 6) | 0xc0;
            pbVar10[1] = bVar7 & 0x3f | 0x80;
            pbVar10 = pbVar10 + 2;
            pSrc = pUVar13;
          }
          else if ((ushort)(UVar6 + L'\x2000') < 0xf800) {
            if ((long)pbVar17 - (long)pbVar10 < 3) {
              uVar14 = 3;
              break;
            }
            *pbVar10 = (byte)((ushort)UVar6 >> 0xc) | 0xe0;
            pbVar10[1] = (byte)((ushort)UVar6 >> 6) & 0x3f | 0x80;
            pbVar10[2] = bVar7 & 0x3f | 0x80;
            pbVar10 = pbVar10 + 3;
            pSrc = pUVar13;
          }
          else {
            if ((pUVar13 < pUVar3 && ((ushort)UVar6 >> 10 & 1) == 0) &&
               (UVar1 = *pUVar13, (UVar1 & 0xfc00U) == 0xdc00)) {
              pUVar13 = pSrc + 2;
              c = (uint)(ushort)UVar6 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
            }
            else {
              if (subchar < 0) goto LAB_002d2152;
              local_48 = local_48 + 1;
              c = subchar;
            }
            uVar14 = 1;
            if ((((0x7f < c) && (uVar14 = 2, 0x7ff < c)) && (uVar14 = 3, 0xd7ff < c)) &&
               (uVar14 = 0, 0xffefdfff < c - 0x110000)) {
              uVar14 = 4 - (c < 0x10000);
            }
            if ((long)pbVar17 - (long)pbVar10 < (long)(ulong)uVar14) break;
            pbVar10 = _appendUTF8(pbVar10,c);
            pSrc = pUVar13;
          }
        }
        if (pUVar13 < pUVar3) {
          iVar15 = 3;
          if ((uint)subchar < 0x800) {
            iVar15 = 2 - (uint)((uint)subchar < 0x80);
          }
          iVar2 = 0;
          if (0xdfff < (uint)subchar) {
            iVar2 = 4 - (uint)((uint)subchar < 0x10000);
          }
          if ((uint)subchar < 0xd800) {
            iVar2 = iVar15;
          }
          do {
            pUVar4 = pUVar13 + 1;
            UVar6 = *pUVar13;
            if ((ushort)UVar6 < 0x80) {
              uVar14 = uVar14 + 1;
            }
            else if ((ushort)UVar6 < 0x800) {
              uVar14 = uVar14 + 2;
            }
            else if ((UVar6 & 0xf800U) == 0xd800) {
              if ((pUVar4 < pUVar3 && ((ushort)UVar6 >> 10 & 1) == 0) &&
                 ((*pUVar4 & 0xfc00U) == 0xdc00)) {
                pUVar4 = pUVar13 + 2;
                uVar14 = uVar14 + 4;
              }
              else {
                if (subchar < 0) {
LAB_002d2152:
                  *pErrorCode = U_INVALID_CHAR_FOUND;
                  return (char *)0x0;
                }
                uVar14 = uVar14 + iVar2;
                local_48 = local_48 + 1;
              }
            }
            else {
              uVar14 = uVar14 + 3;
            }
            pUVar13 = pUVar4;
          } while (pUVar4 < pUVar3);
        }
      }
LAB_002d2263:
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = local_48;
      }
      iVar15 = uVar14 + ((int)pbVar10 - (int)dest);
      if (pDestLength != (int32_t *)0x0) {
        *pDestLength = iVar15;
      }
      u_terminateChars_63(dest,destCapacity,iVar15,pErrorCode);
      return dest;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
}

Assistant:

U_CAPI char* U_EXPORT2 
u_strToUTF8WithSub(char *dest,
            int32_t destCapacity,
            int32_t *pDestLength,
            const UChar *pSrc,
            int32_t srcLength,
            UChar32 subchar, int32_t *pNumSubstitutions,
            UErrorCode *pErrorCode){
    int32_t reqLength=0;
    uint32_t ch=0,ch2=0;
    uint8_t *pDest = (uint8_t *)dest;
    uint8_t *pDestLimit = (pDest!=NULL)?(pDest + destCapacity):NULL;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
        
    if( (pSrc==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    numSubstitutions=0;

    if(srcLength==-1) {
        while((ch=*pSrc)!=0) {
            ++pSrc;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                /*need not check for NUL because NUL fails U16_IS_TRAIL() anyway*/
                if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while((ch=*pSrc++)!=0) {
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    } else {
        const UChar *pSrcLimit = (pSrc!=NULL)?(pSrc+srcLength):NULL;
        int32_t count;

        /* Faster loop without ongoing checking for pSrcLimit and pDestLimit. */
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            count = (int32_t)((pDestLimit - pDest) / 3);
            srcLength = (int32_t)(pSrcLimit - pSrc);
            if(count > srcLength) {
                count = srcLength; /* min(remaining dest/3, remaining src) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }
            do {
                ch=*pSrc++;
                if(ch <= 0x7f) {
                    *pDest++ = (uint8_t)ch;
                } else if(ch <= 0x7ff) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else if(ch <= 0xd7ff || ch >= 0xe000) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else /* ch is a surrogate */ {
                    /*
                     * We will read two UChars and probably output four bytes,
                     * which we didn't account for with computing count,
                     * so we adjust it here.
                     */
                    if(--count == 0) {
                        --pSrc; /* undo ch=*pSrc++ for the lead surrogate */
                        break;  /* recompute count */
                    }

                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                        ++pSrc;
                        ch=U16_GET_SUPPLEMENTARY(ch, ch2);

                        /* writing 4 bytes per 2 UChars is ok */
                        *pDest++=(uint8_t)((ch>>18)|0xf0);
                        *pDest++=(uint8_t)(((ch>>12)&0x3f)|0x80);
                        *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                        *pDest++=(uint8_t)((ch&0x3f)|0x80);
                    } else  {
                        /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                        if(subchar>=0) {
                            ch=subchar;
                            ++numSubstitutions;
                        } else {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        }

                        /* convert and append*/
                        pDest=_appendUTF8(pDest, ch);
                    }
                }
            } while(--count > 0);
        }

        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    }

    reqLength+=(int32_t)(pDest - (uint8_t *)dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}